

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

void VCProjectWriter::outputFileConfig(VCFilter *filter,XmlOutput *xml,QString *filename)

{
  VCProjectWriter *pVVar1;
  QString str;
  bool bVar2;
  XmlOutput *pXVar3;
  long in_FS_OFFSET;
  bool inBuild;
  VCCLCompilerTool *this;
  VCCustomBuildTool *this_00;
  Data *in_stack_fffffffffffffba8;
  xml_output local_440;
  QArrayDataPointer<char16_t> local_408;
  xml_output local_3f0;
  QArrayDataPointer<char16_t> local_3b8;
  QArrayDataPointer<char16_t> local_3a0;
  VCFilterFile local_388;
  bool local_359;
  VCCLCompilerTool local_358;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  filter->useCustomBuildTool = false;
  filter->useCompilerTool = false;
  VCCustomBuildTool::VCCustomBuildTool((VCCustomBuildTool *)&local_358);
  this_00 = &filter->CustomBuildTool;
  VCCustomBuildTool::operator=(this_00,(VCCustomBuildTool *)&local_358);
  VCCustomBuildTool::~VCCustomBuildTool((VCCustomBuildTool *)&local_358);
  VCCLCompilerTool::VCCLCompilerTool(&local_358);
  this = &filter->CompilerTool;
  VCCLCompilerTool::operator=(this,&local_358);
  VCCLCompilerTool::~VCCLCompilerTool(&local_358);
  (filter->CustomBuildTool).config = filter->Config;
  (filter->CompilerTool).BufferSecurityCheck = unset;
  (filter->CompilerTool).DebugInformationFormat = debugUnknown;
  (filter->CompilerTool).ExceptionHandling = ehDefault;
  (filter->CompilerTool).GeneratePreprocessedFile = preprocessUnknown;
  (filter->CompilerTool).Optimization = optimizeDefault;
  QString::clear(&(filter->CompilerTool).ProgramDataBaseFileName);
  (filter->CompilerTool).RuntimeLibrary = rtUnknown;
  (filter->CompilerTool).WarningLevel = warningLevelUnknown;
  (filter->CompilerTool).config = filter->Config;
  local_359 = true;
  local_388.file.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_388.file.d.size = -0x5555555555555556;
  local_388.excludeFromBuild = true;
  local_388._1_7_ = 0xaaaaaaaaaaaaaa;
  local_388.file.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  VCFilter::findFile(&local_388,filter,filename,&local_359);
  local_359 = (bool)(local_359 & (local_388.excludeFromBuild ^ 1U));
  if (local_359 == false) {
    if (local_388.excludeFromBuild != false) {
      filter->useCompilerTool = true;
    }
  }
  else {
    VCFilter::addExtraCompiler(filter,&local_388);
    if (filter->Project->usePCH == true) {
      local_3a0.d = local_388.file.d.d;
      local_3a0.ptr = local_388.file.d.ptr;
      local_3a0.size = local_388.file.d.size;
      if (local_388.file.d.d != (Data *)0x0) {
        LOCK();
        ((local_388.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_388.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             1;
        UNLOCK();
      }
      str.d.ptr = (char16_t *)this_00;
      str.d.d = (Data *)this;
      str.d.size = (qsizetype)in_stack_fffffffffffffba8;
      VCFilter::modifyPCHstage(filter,str);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a0);
    }
  }
  bVar2 = local_359;
  if (((filter->useCustomBuildTool == true) || (filter->useCompilerTool != false)) ||
     ((local_359 & 1U) == 0)) {
    QString::QString((QString *)&local_3b8,"FileConfiguration");
    tag((xml_output *)&local_358,(QString *)&local_3b8);
    pXVar3 = XmlOutput::operator<<(xml,(xml_output *)&local_358);
    QString::QString((QString *)&local_408,"Name");
    attribute(&local_3f0,(QString *)&local_408,&filter->Config->Name);
    pXVar3 = XmlOutput::operator<<(pXVar3,&local_3f0);
    if ((bVar2 & 1U) == 0) {
      QString::QString((QString *)&stack0xfffffffffffffba8,"true");
      attrS(&local_440,"ExcludedFromBuild",(QString *)&stack0xfffffffffffffba8);
    }
    else {
      noxml();
    }
    XmlOutput::operator<<(pXVar3,&local_440);
    XmlOutput::xml_output::~xml_output(&local_440);
    if ((bVar2 & 1U) == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffba8);
    }
    XmlOutput::xml_output::~xml_output(&local_3f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_408);
    XmlOutput::xml_output::~xml_output((xml_output *)&local_358);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3b8);
    if (filter->useCustomBuildTool == true) {
      pVVar1 = filter->Project->projectWriter;
      (*pVVar1->_vptr_VCProjectWriter[8])(pVVar1,xml,this_00);
    }
    if (filter->useCompilerTool == true) {
      pVVar1 = filter->Project->projectWriter;
      (*pVVar1->_vptr_VCProjectWriter[4])(pVVar1,xml,this);
    }
    QString::QString((QString *)&local_3f0,"FileConfiguration");
    closetag((xml_output *)&local_358,(QString *)&local_3f0);
    XmlOutput::operator<<(xml,(xml_output *)&local_358);
    XmlOutput::xml_output::~xml_output((xml_output *)&local_358);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3f0);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_388.file.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VCProjectWriter::outputFileConfig(VCFilter &filter, XmlOutput &xml, const QString &filename)
{
    // Clearing each filter tool
    filter.useCustomBuildTool = false;
    filter.useCompilerTool = false;
    filter.CustomBuildTool = VCCustomBuildTool();
    filter.CompilerTool = VCCLCompilerTool();

    // Unset some default options
    filter.CustomBuildTool.config = filter.Config;
    filter.CompilerTool.BufferSecurityCheck = unset;
    filter.CompilerTool.DebugInformationFormat = debugUnknown;
    filter.CompilerTool.ExceptionHandling = ehDefault;
    filter.CompilerTool.GeneratePreprocessedFile = preprocessUnknown;
    filter.CompilerTool.Optimization = optimizeDefault;
    filter.CompilerTool.ProgramDataBaseFileName.clear();
    filter.CompilerTool.RuntimeLibrary = rtUnknown;
    filter.CompilerTool.WarningLevel = warningLevelUnknown;
    filter.CompilerTool.config = filter.Config;

    bool inBuild;
    VCFilterFile info = filter.findFile(filename, &inBuild);
    inBuild &= !info.excludeFromBuild;

    if (inBuild) {
        filter.addExtraCompiler(info);
        if(filter.Project->usePCH)
            filter.modifyPCHstage(info.file);
    } else {
        // Excluded files uses an empty compiler stage
        if(info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (filter.useCustomBuildTool || filter.useCompilerTool || !inBuild) {
        xml << tag(_FileConfiguration)
                << attr(_Name, filter.Config->Name)
                << (!inBuild ? attrS(_ExcludedFromBuild, "true") : noxml());
        if (filter.useCustomBuildTool)
            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        if (filter.useCompilerTool)
            filter.Project->projectWriter->write(xml, filter.CompilerTool);
        xml << closetag(_FileConfiguration);
    }
}